

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

char * cram_get_ref(cram_fd *fd,int id,int start,int end)

{
  refs_t **pprVar1;
  pthread_mutex_t *__mutex;
  long lVar2;
  size_t __n;
  uint start_00;
  int iVar3;
  ref_entry **pprVar4;
  ref_entry *prVar5;
  SAM_hdr_type *type;
  SAM_hdr_tag *pSVar6;
  mFILE *mf;
  FILE *__s;
  int *piVar7;
  refs_t *prVar8;
  size_t sVar9;
  BGZF *pBVar10;
  ref_entry *e;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  stat sb;
  char path [4096];
  char path_tmp [4096];
  char cache [4096];
  char *local_3100;
  char *local_30d0;
  stat local_30c8;
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  if (id == -1) {
    return (char *)0x0;
  }
  __mutex = &fd->ref_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (fd->unsorted != 0) {
    fd->shared_ref = 1;
  }
  prVar8 = fd->refs;
  if (id < prVar8->nref) {
    e = prVar8->ref_id[id];
    if (e != (ref_entry *)0x0) {
      pprVar1 = &fd->refs;
      pthread_mutex_lock((pthread_mutex_t *)&prVar8->lock);
      if (e->length == 0) {
        local_30d0 = getenv("REF_PATH");
        local_3100 = getenv("REF_CACHE");
        if (fd->verbose != 0) {
          fprintf(_stderr,"cram_populate_ref on fd %p, id %d\n",fd,(ulong)(uint)id);
        }
        if ((local_30d0 == (char *)0x0) || (*local_30d0 == '\0')) {
          if ((local_3100 == (char *)0x0) || (*local_3100 == '\0')) {
            pcVar13 = getenv("XDG_CACHE_HOME");
            if ((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) {
              pcVar13 = getenv("HOME");
              if ((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) {
                pcVar13 = getenv("TMPDIR");
                if (((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) &&
                   ((pcVar13 = getenv("TEMP"), pcVar13 == (char *)0x0 || (*pcVar13 == '\0')))) {
                  pcVar13 = "/tmp";
                }
                goto LAB_001296f9;
              }
              pcVar11 = "/.cache";
            }
            else {
LAB_001296f9:
              pcVar11 = "";
            }
            local_3100 = local_1038;
            snprintf(local_3100,0x1000,"%s%s/hts-ref/%%2s/%%2s/%%s",pcVar13,pcVar11);
            local_30d0 = "http://www.ebi.ac.uk:80/ena/cram/md5/%s";
            if (fd->verbose != 0) {
              local_3100 = local_1038;
              fprintf(_stderr,"Populating local cache: %s\n");
            }
          }
          else {
            local_30d0 = "http://www.ebi.ac.uk:80/ena/cram/md5/%s";
          }
        }
        if ((e->name == (char *)0x0) ||
           (type = sam_hdr_find(fd->header,"SQ","SN",e->name), type == (SAM_hdr_type *)0x0))
        goto LAB_001299d1;
        pSVar6 = sam_hdr_find_key(fd->header,type,"M5",(SAM_hdr_tag **)0x0);
        if (pSVar6 == (SAM_hdr_tag *)0x0) {
LAB_001298f9:
          pSVar6 = sam_hdr_find_key(fd->header,type,"UR",(SAM_hdr_tag **)0x0);
          if (pSVar6 == (SAM_hdr_tag *)0x0) {
LAB_001299d1:
            cram_get_ref_cold_2();
            return (char *)0x0;
          }
          pcVar11 = pSVar6->str;
          pcVar13 = pcVar11 + 3;
          iVar3 = strncmp(pcVar13,"file:",5);
          pcVar11 = pcVar11 + 8;
          if (iVar3 != 0) {
            pcVar11 = pcVar13;
          }
          prVar8 = *pprVar1;
          if (prVar8->fp != (BGZF *)0x0) {
            iVar3 = bgzf_close(prVar8->fp);
            if (iVar3 != 0) goto LAB_001299d1;
            prVar8 = *pprVar1;
            prVar8->fp = (BGZF *)0x0;
          }
          prVar8 = refs_load_fai(prVar8,pcVar11,0);
          if (prVar8 == (refs_t *)0x0) goto LAB_001299d1;
          *pprVar1 = prVar8;
          if (prVar8->fp != (BGZF *)0x0) {
            iVar3 = bgzf_close(prVar8->fp);
            if (iVar3 != 0) goto LAB_001299d1;
            prVar8 = *pprVar1;
            prVar8->fp = (BGZF *)0x0;
          }
          if ((((prVar8->fn == (char *)0x0) || (iVar3 = refs2id(prVar8,fd->header), iVar3 == -1)) ||
              ((*pprVar1)->ref_id == (ref_entry **)0x0)) ||
             ((*pprVar1)->ref_id[id] == (ref_entry *)0x0)) goto LAB_001299d1;
        }
        else {
          if (fd->verbose != 0) {
            cram_get_ref_cold_1();
          }
          if ((local_3100 == (char *)0x0) || (*local_3100 == '\0')) {
LAB_001297e6:
            mf = open_path_mfile(pSVar6->str + 3,local_30d0,(char *)0x0);
            if (mf == (mFILE *)0x0) goto LAB_001298f9;
            pcVar13 = (char *)mfsteal(mf,&local_30c8.st_dev);
            e->seq = pcVar13;
            e->length = local_30c8.st_dev;
            if ((local_3100 != (char *)0x0) && (*local_3100 != '\0')) {
              expand_cache_path(local_3038,local_3100,pSVar6->str + 3);
              if (fd->verbose != 0) {
                fprintf(_stderr,"Path=\'%s\'\n",local_3038);
              }
              mkdir_prefix(local_3038,0x3ff);
              uVar12 = 0;
              do {
                sprintf(local_2038,"%s.tmp_%d",local_3038,uVar12);
                __s = fopen(local_2038,"wx");
                if (__s != (FILE *)0x0) {
                  __n = e->length;
                  sVar9 = fwrite(e->seq,1,__n,__s);
                  if (__n != sVar9) {
                    perror(local_3038);
                  }
                  iVar3 = paranoid_fclose((FILE *)__s);
                  if (iVar3 == -1) {
                    unlink(local_2038);
                  }
                  else {
                    iVar3 = chmod(local_2038,0x124);
                    if (iVar3 == 0) {
                      rename(local_2038,local_3038);
                    }
                    else {
                      unlink(local_2038);
                    }
                  }
                  goto LAB_00129c67;
                }
                uVar12 = (ulong)((int)uVar12 + 1);
                piVar7 = __errno_location();
              } while (*piVar7 == 0x11);
              perror(local_2038);
            }
          }
          else {
            expand_cache_path(local_3038,local_3100,pSVar6->str + 3);
            iVar3 = stat(local_3038,&local_30c8);
            if ((iVar3 != 0) || (pBVar10 = bgzf_open(local_3038,"r"), pBVar10 == (BGZF *)0x0))
            goto LAB_001297e6;
            e->length = local_30c8.st_size;
            e->offset = 0;
            e->bases_per_line = 0;
            e->line_length = 0;
            pcVar13 = string_dup((*pprVar1)->pool,local_3038);
            e->fn = pcVar13;
            prVar8 = *pprVar1;
            if (prVar8->fp != (BGZF *)0x0) {
              iVar3 = bgzf_close(prVar8->fp);
              if (iVar3 != 0) goto LAB_001299d1;
              prVar8 = *pprVar1;
              pcVar13 = e->fn;
            }
            prVar8->fp = pBVar10;
            prVar8->fn = pcVar13;
          }
        }
LAB_00129c67:
        prVar8 = fd->refs;
        e = prVar8->ref_id[id];
        if (((-1 < id) && (fd->unsorted != 0)) && (e->seq != (char *)0x0)) {
          if (prVar8->last_id == id) {
            prVar8->last_id = -1;
          }
          e->count = e->count + 1;
        }
      }
      if (start < 1) {
        __assert_fail("start >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                      ,0x934,"char *cram_get_ref(cram_fd *, int, int, int)");
      }
      lVar2 = e->length;
      iVar3 = (int)lVar2;
      if (end < 1) {
        end = iVar3;
      }
      if (lVar2 <= end) {
        end = iVar3;
      }
      start_00 = start;
      if ((double)lVar2 * 0.5 <= (double)(end - start)) {
        end = iVar3;
        start_00 = 1;
      }
      if (((fd->shared_ref != 0) || (e->seq != (char *)0x0)) || ((start_00 == 1 && (lVar2 == end))))
      {
        if (id < 0) {
          fd->ref = (char *)0x0;
          prVar8 = fd->refs;
          pcVar13 = (char *)0x0;
        }
        else {
          prVar8 = *pprVar1;
          if (e->seq == (char *)0x0) {
            prVar5 = cram_ref_load(prVar8,id);
            if (prVar5 == (ref_entry *)0x0) {
              prVar8 = *pprVar1;
              goto LAB_00129b2f;
            }
            prVar8 = fd->refs;
            pprVar4 = prVar8->ref_id;
            if (fd->unsorted != 0) {
              prVar5 = pprVar4[(uint)id];
              pcVar13 = prVar5->seq;
              goto joined_r0x001295e6;
            }
          }
          else {
            pprVar4 = prVar8->ref_id;
            prVar5 = pprVar4[(uint)id];
            pcVar13 = prVar5->seq;
joined_r0x001295e6:
            if (pcVar13 != (char *)0x0) {
              if (prVar8->last_id == id) {
                prVar8->last_id = -1;
              }
              prVar5->count = prVar5->count + 1;
            }
          }
          fd->ref = (char *)0x0;
          fd->ref_start = 1;
          fd->ref_end = (int)e->length;
          fd->ref_id = id;
          pcVar13 = pprVar4[id]->seq + ((ulong)(uint)start - 1);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&prVar8->lock);
        goto LAB_00129573;
      }
      if (id < 0) {
        if (fd->ref_free != (char *)0x0) {
          free(fd->ref_free);
          fd->ref_free = (char *)0x0;
        }
        fd->ref = (char *)0x0;
        fd->ref_id = id;
        prVar8 = fd->refs;
LAB_00129b2f:
        pthread_mutex_unlock((pthread_mutex_t *)&prVar8->lock);
      }
      else {
        prVar8 = *pprVar1;
        pcVar13 = e->fn;
        pcVar11 = pcVar13;
        iVar3 = strcmp(prVar8->fn,pcVar13);
        pBVar10 = prVar8->fp;
        if (iVar3 == 0) {
          if (pBVar10 == (BGZF *)0x0) goto LAB_00129b92;
        }
        else {
          if (pBVar10 != (BGZF *)0x0) {
            iVar3 = bgzf_close(pBVar10);
            if (iVar3 != 0) {
              return (char *)0x0;
            }
            pcVar13 = e->fn;
            prVar8 = *pprVar1;
          }
LAB_00129b92:
          prVar8->fn = pcVar13;
          pBVar10 = bgzf_open_ref(pcVar13,pcVar11);
          prVar8 = *pprVar1;
          prVar8->fp = pBVar10;
          if (pBVar10 == (BGZF *)0x0) goto LAB_00129b2f;
        }
        pcVar13 = load_ref_portion(pBVar10,e,start_00,end);
        fd->ref = pcVar13;
        if (pcVar13 != (char *)0x0) {
          if (fd->ref_free != (char *)0x0) {
            free(fd->ref_free);
            pcVar13 = fd->ref;
          }
          fd->ref_id = id;
          fd->ref_start = start_00;
          fd->ref_end = end;
          fd->ref_free = pcVar13;
          pthread_mutex_unlock((pthread_mutex_t *)&fd->refs->lock);
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return pcVar13 + ((ulong)(uint)start - (ulong)start_00);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&(*pprVar1)->lock);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return (char *)0x0;
    }
  }
  pcVar13 = (char *)0x0;
  fprintf(_stderr,"No reference found for id %d\n",(ulong)(uint)id);
LAB_00129573:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return pcVar13;
}

Assistant:

char *cram_get_ref(cram_fd *fd, int id, int start, int end) {
    ref_entry *r;
    char *seq;
    int ostart = start;

    if (id == -1)
	return NULL;

    /* FIXME: axiomatic query of r->seq being true?
     * Or shortcut for unsorted data where we load once and never free?
     */

    //fd->shared_ref = 1; // hard code for now to simplify things

    pthread_mutex_lock(&fd->ref_lock);

    RP("%d cram_get_ref on fd %p, id %d, range %d..%d\n", gettid(), fd, id, start, end);

    /*
     * Unsorted data implies we want to fetch an entire reference at a time.
     * We just deal with this at the moment by claiming we're sharing
     * references instead, which has the same requirement.
     */
    if (fd->unsorted)
	fd->shared_ref = 1;


    /* Sanity checking: does this ID exist? */
    if (id >= fd->refs->nref) {
	fprintf(stderr, "No reference found for id %d\n", id);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    if (!fd->refs || !fd->refs->ref_id[id]) {
	fprintf(stderr, "No reference found for id %d\n", id);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    if (!(r = fd->refs->ref_id[id])) {
	fprintf(stderr, "No reference found for id %d\n", id);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }


    /*
     * It has an entry, but may not have been populated yet.
     * Any manually loaded .fai files have their lengths known.
     * A ref entry computed from @SQ lines (M5 or UR field) will have
     * r->length == 0 unless it's been loaded once and verified that we have
     * an on-disk filename for it.
     *
     * 19 Sep 2013: Moved the lock here as the cram_populate_ref code calls
     * open_path_mfile and libcurl, which isn't multi-thread safe unless I
     * rewrite my code to have one curl handle per thread.
     */
    pthread_mutex_lock(&fd->refs->lock);
    if (r->length == 0) {
	if (cram_populate_ref(fd, id, r) == -1) {
	    fprintf(stderr, "Failed to populate reference for id %d\n", id);
	    pthread_mutex_unlock(&fd->refs->lock);
	    pthread_mutex_unlock(&fd->ref_lock);
	    return NULL;
	}
	r = fd->refs->ref_id[id];
	if (fd->unsorted)
	    cram_ref_incr_locked(fd->refs, id);
    }


    /*
     * We now know that we the filename containing the reference, so check
     * for limits. If it's over half the reference we'll load all of it in
     * memory as this will speed up subsequent calls.
     */
    if (end < 1)
	end = r->length;
    if (end >= r->length)
	end  = r->length; 
    assert(start >= 1);

    if (end - start >= 0.5*r->length || fd->shared_ref) {
	start = 1;
	end = r->length;
    }
    
    /*
     * Maybe we have it cached already? If so use it.
     *
     * Alternatively if we don't have the sequence but we're sharing
     * references and/or are asking for the entire length of it, then
     * load the full reference into the refs structure and return
     * a pointer to that one instead.
     */
    if (fd->shared_ref || r->seq || (start == 1 && end == r->length)) {
	char *cp;

	if (id >= 0) {
	    if (r->seq) {
		cram_ref_incr_locked(fd->refs, id);
	    } else {
		ref_entry *e;
		if (!(e = cram_ref_load(fd->refs, id))) {
		    pthread_mutex_unlock(&fd->refs->lock);
		    pthread_mutex_unlock(&fd->ref_lock);
		    return NULL;
		}

		/* unsorted data implies cache ref indefinitely, to avoid
		 * continually loading and unloading.
		 */
		if (fd->unsorted)
		    cram_ref_incr_locked(fd->refs, id);
	    }	    

	    fd->ref = NULL; /* We never access it directly */
	    fd->ref_start = 1;
	    fd->ref_end   = r->length;
	    fd->ref_id    = id;

	    cp = fd->refs->ref_id[id]->seq + ostart-1;
	} else {
	    fd->ref = NULL;
	    cp = NULL;
	}

	RP("%d cram_get_ref returning for id %d, count %d\n", gettid(), id, (int)r->count);

	pthread_mutex_unlock(&fd->refs->lock);
	pthread_mutex_unlock(&fd->ref_lock);
	return cp;
    }

    /*
     * Otherwise we're not sharing, we don't have a copy of it already and
     * we're only asking for a small portion of it.
     *
     * In this case load up just that segment ourselves, freeing any old
     * small segments in the process.
     */

    /* Unmapped ref ID */
    if (id < 0) {
	if (fd->ref_free) {
	    free(fd->ref_free);
	    fd->ref_free = NULL;
	}
	fd->ref = NULL;
	fd->ref_id = id;
	pthread_mutex_unlock(&fd->refs->lock);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    /* Open file if it's not already the current open reference */
    if (strcmp(fd->refs->fn, r->fn) || fd->refs->fp == NULL) {
	if (fd->refs->fp)
	    if (bgzf_close(fd->refs->fp) != 0)
		return NULL;
	fd->refs->fn = r->fn;
	if (!(fd->refs->fp = bgzf_open_ref(fd->refs->fn, "r"))) {
	    pthread_mutex_unlock(&fd->refs->lock);
	    pthread_mutex_unlock(&fd->ref_lock);
	    return NULL;
	}
    }

    if (!(fd->ref = load_ref_portion(fd->refs->fp, r, start, end))) {
	pthread_mutex_unlock(&fd->refs->lock);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    if (fd->ref_free)
	free(fd->ref_free);

    fd->ref_id    = id;
    fd->ref_start = start;
    fd->ref_end   = end;
    fd->ref_free = fd->ref;
    seq = fd->ref;

    pthread_mutex_unlock(&fd->refs->lock);
    pthread_mutex_unlock(&fd->ref_lock);

    return seq + ostart - start;
}